

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferReader.hh
# Opt level: O1

void __thiscall avro::BufferReader::incrementChunk(BufferReader *this,size_type howmuch)

{
  _Elt_pointer pCVar1;
  _Map_pointer ppCVar2;
  Chunk *pCVar3;
  size_type sVar4;
  
  this->bytesRemaining_ = this->bytesRemaining_ - howmuch;
  sVar4 = howmuch + this->chunkPos_;
  this->chunkPos_ = sVar4;
  pCVar1 = (this->iter_)._M_cur;
  if (sVar4 == (long)pCVar1->writePos_ - (long)pCVar1->readPos_) {
    this->chunkPos_ = 0;
    (this->iter_)._M_cur = pCVar1 + 1;
    if (pCVar1 + 1 == (this->iter_)._M_last) {
      ppCVar2 = (this->iter_)._M_node;
      (this->iter_)._M_node = ppCVar2 + 1;
      pCVar3 = ppCVar2[1];
      (this->iter_)._M_first = pCVar3;
      (this->iter_)._M_last = pCVar3 + 9;
      (this->iter_)._M_cur = pCVar3;
      return;
    }
  }
  return;
}

Assistant:

void incrementChunk(size_type howmuch) {
        bytesRemaining_ -= howmuch;
        chunkPos_ += howmuch;
        if(chunkPos_ == iter_->dataSize()) {
            chunkPos_ = 0;
            ++iter_;
        }
    }